

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_initialize_registered(plugin_manager manager,plugin p)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_RSI;
  undefined8 in_RDI;
  loader_initialization_order order;
  size_t size;
  size_t iterator;
  loader_manager_impl manager_impl;
  ulong local_28;
  
  lVar1 = plugin_manager_impl(in_RDI);
  uVar2 = vector_size(*(undefined8 *)(lVar1 + 8));
  local_28 = 0;
  while( true ) {
    if (uVar2 <= local_28) {
      return 1;
    }
    lVar3 = vector_at(*(undefined8 *)(lVar1 + 8),local_28);
    if (*(long *)(lVar3 + 8) == in_RSI) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

int loader_impl_initialize_registered(plugin_manager manager, plugin p)
{
	loader_manager_impl manager_impl = plugin_manager_impl_type(manager, loader_manager_impl);
	size_t iterator, size = vector_size(manager_impl->initialization_order);

	/* Check if the plugin has been properly registered into initialization order list */
	for (iterator = 0; iterator < size; ++iterator)
	{
		loader_initialization_order order = vector_at(manager_impl->initialization_order, iterator);

		if (order->p == p)
		{
			return 0;
		}
	}

	return 1;
}